

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O3

int res(sunrealtype t,N_Vector yy,N_Vector yd,N_Vector resval,void *userdata)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 (*pauVar14) [16];
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar21 = *(double *)((long)userdata + 0x10);
  uVar1 = *(undefined8 *)((long)userdata + 0x20);
  dVar2 = *(double *)((long)userdata + 0x28);
  dVar3 = *(double *)((long)userdata + 0x30);
  uVar4 = *(undefined8 *)((long)userdata + 0x38);
  uVar5 = *(undefined8 *)((long)userdata + 0x40);
  pauVar14 = *(undefined1 (**) [16])((long)yy->content + 0x10);
  dVar6 = *(double *)(pauVar14[1] + 8);
  dVar23 = *(double *)pauVar14[2];
  dVar7 = *(double *)(pauVar14[2] + 8);
  pdVar15 = *(double **)((long)yd->content + 0x10);
  dVar8 = *pdVar15;
  dVar9 = pdVar15[1];
  dVar10 = pdVar15[2];
  dVar11 = pdVar15[3];
  dVar12 = *(double *)((long)userdata + 0x18);
  dVar18 = SUB168(*pauVar14,0);
  __x = SUB168(*pauVar14,8);
  dVar13 = pdVar15[4];
  dVar16 = *userdata;
  dVar17 = *(double *)((long)userdata + 8);
  dVar25 = *(double *)pauVar14[1];
  dVar22 = (double)SUNRpowerI(4);
  if (__x < 0.0) {
    dVar24 = sqrt(__x);
  }
  else {
    dVar24 = SQRT(__x);
  }
  dVar24 = dVar22 * dVar16 * dVar24;
  dVar25 = dVar25 * dVar17 * dVar6;
  dVar21 = dVar21 * dVar18 * dVar6 * dVar6;
  if (__x < 0.0) {
    dVar22 = sqrt(__x);
  }
  else {
    dVar22 = SQRT(__x);
  }
  dVar22 = dVar12 * dVar7 * dVar7 * dVar22;
  auVar19._8_8_ = dVar17;
  auVar19._0_8_ = uVar4;
  auVar20._8_4_ = (int)uVar1;
  auVar20._0_8_ = uVar5;
  auVar20._12_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar20 = divpd(auVar19,auVar20);
  dVar23 = dVar23 * auVar20._8_8_ * dVar18;
  pdVar15 = *(double **)((long)resval->content + 0x10);
  *pdVar15 = ((dVar24 + dVar24 + dVar8) - dVar25) + dVar23 + dVar21;
  pdVar15[1] = (dVar22 * 0.5 + dVar24 * 0.5 + dVar9 + dVar21) - dVar2 * (auVar20._0_8_ - __x);
  pdVar15[2] = ((dVar10 - dVar24) + dVar25) - dVar23;
  pdVar15[3] = dVar21 + dVar21 + ((dVar11 + dVar25) - dVar23);
  pdVar15[4] = ((dVar13 - dVar25) + dVar23) - dVar22;
  pdVar15[5] = dVar3 * dVar18 * dVar6 - dVar7;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yd, N_Vector resval,
               void* userdata)
{
  UserData data;
  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks, pCO2, H;

  sunrealtype y1, y2, y3, y4, y5, y6;
  sunrealtype yd1, yd2, yd3, yd4, yd5;

  sunrealtype r1, r2, r3, r4, r5, Fin;

  data = (UserData)userdata;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;
  pCO2 = data->pCO2;
  H    = data->H;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yd1 = Ith(yd, 1);
  yd2 = Ith(yd, 2);
  yd3 = Ith(yd, 3);
  yd4 = Ith(yd, 4);
  yd5 = Ith(yd, 5);

  r1  = k1 * SUNRpowerI(y1, 4) * sqrt(y2);
  r2  = k2 * y3 * y4;
  r3  = k2 / K * y1 * y5;
  r4  = k3 * y1 * y4 * y4;
  r5  = k4 * y6 * y6 * sqrt(y2);
  Fin = klA * (pCO2 / H - y2);

  Ith(resval, 1) = yd1 + TWO * r1 - r2 + r3 + r4;
  Ith(resval, 2) = yd2 + HALF * r1 + r4 + HALF * r5 - Fin;
  Ith(resval, 3) = yd3 - r1 + r2 - r3;
  Ith(resval, 4) = yd4 + r2 - r3 + TWO * r4;
  Ith(resval, 5) = yd5 - r2 + r3 - r5;
  Ith(resval, 6) = Ks * y1 * y4 - y6;

  return (0);
}